

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_util.h
# Opt level: O2

FieldDescriptor * __thiscall
google::protobuf::TestUtil::ReflectionTester::F(ReflectionTester *this,string *name)

{
  ushort *puVar1;
  FileDescriptor *this_00;
  bool bVar2;
  FieldDescriptor *pFVar3;
  string_view name_00;
  string_view name_01;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  string local_98;
  LogMessageFatal local_78 [3];
  AlphaNum local_48;
  
  puVar1 = (ushort *)(this->base_descriptor_->all_names_).payload_;
  __x._M_len = (ulong)*puVar1;
  __x._M_str = (char *)((long)puVar1 + ~__x._M_len);
  __y._M_str = "TestAllExtensions";
  __y._M_len = 0x11;
  bVar2 = std::operator==(__x,__y);
  if (!bVar2) {
    puVar1 = (ushort *)(this->base_descriptor_->all_names_).payload_;
    __x_00._M_len = (ulong)*puVar1;
    __x_00._M_str = (char *)((long)puVar1 + ~__x_00._M_len);
    __y_00._M_str = "TestPackedExtensions";
    __y_00._M_len = 0x14;
    bVar2 = std::operator==(__x_00,__y_00);
    if (!bVar2) {
      name_01._M_str = (name->_M_dataplus)._M_p;
      name_01._M_len = name->_M_string_length;
      pFVar3 = Descriptor::FindFieldByName(this->base_descriptor_,name_01);
      goto LAB_0050a201;
    }
  }
  this_00 = this->base_descriptor_->file_;
  local_78[0].super_LogMessage.data_._M_t.
  super___uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
  ._M_t.
  super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
  .super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>.
  _M_head_impl = (__uniq_ptr_data<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>,_true,_true>
                  )(name->_M_dataplus)._M_p;
  local_78[0].super_LogMessage._0_8_ = name->_M_string_length;
  local_48.piece_ = absl::lts_20250127::NullSafeStringView("_extension");
  absl::lts_20250127::StrCat_abi_cxx11_(&local_98,(lts_20250127 *)local_78,&local_48,&local_48);
  name_00._M_str = local_98._M_dataplus._M_p;
  name_00._M_len = local_98._M_string_length;
  pFVar3 = FileDescriptor::FindExtensionByName(this_00,name_00);
  std::__cxx11::string::~string((string *)&local_98);
LAB_0050a201:
  if (pFVar3 != (FieldDescriptor *)0x0) {
    return pFVar3;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (local_78,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
             ,0xb2,"result != nullptr");
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(local_78);
}

Assistant:

inline const FieldDescriptor* TestUtil::ReflectionTester::F(
    const std::string& name) {
  const FieldDescriptor* result = nullptr;
  if (base_descriptor_->name() == "TestAllExtensions" ||
      base_descriptor_->name() == "TestPackedExtensions") {
    result = base_descriptor_->file()->FindExtensionByName(
        absl::StrCat(name, "_extension"));
  } else {
    result = base_descriptor_->FindFieldByName(name);
  }
  ABSL_CHECK(result != nullptr);
  return result;
}